

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.H
# Opt level: O3

void __thiscall
Fl_Table::redraw_range(Fl_Table *this,int topRow,int botRow,int leftCol,int rightCol)

{
  if (this->_redraw_toprow == -1) {
    this->_redraw_toprow = topRow;
    this->_redraw_botrow = botRow;
    this->_redraw_leftcol = leftCol;
  }
  else {
    if (topRow < this->_redraw_toprow) {
      this->_redraw_toprow = topRow;
    }
    if (this->_redraw_botrow < botRow) {
      this->_redraw_botrow = botRow;
    }
    if (leftCol < this->_redraw_leftcol) {
      this->_redraw_leftcol = leftCol;
    }
    if (rightCol <= this->_redraw_rightcol) goto LAB_001cd6e8;
  }
  this->_redraw_rightcol = rightCol;
LAB_001cd6e8:
  Fl_Widget::damage((Fl_Widget *)this,'\x01');
  return;
}

Assistant:

void redraw_range(int topRow, int botRow, int leftCol, int rightCol) {
    if ( _redraw_toprow == -1 ) {
      // Initialize redraw range
      _redraw_toprow = topRow;
      _redraw_botrow = botRow;
      _redraw_leftcol = leftCol;
      _redraw_rightcol = rightCol;
    } else {
      // Extend redraw range
      if ( topRow < _redraw_toprow ) _redraw_toprow = topRow;
      if ( botRow > _redraw_botrow ) _redraw_botrow = botRow;
      if ( leftCol < _redraw_leftcol ) _redraw_leftcol = leftCol;
      if ( rightCol > _redraw_rightcol ) _redraw_rightcol = rightCol;
    }
    
    // Indicate partial redraw needed of some cells
    damage(FL_DAMAGE_CHILD);
  }